

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectProgramInterfaceiv
          (FunctionalTest3_4 *this,GLuint program_id)

{
  bool bVar1;
  uint local_60;
  GLuint i;
  GLuint n_details;
  inspectionDetailsForProgramInterface details [5];
  bool result;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  details[4].expected_value._3_1_ = 1;
  i = 0x92ee;
  n_details = 0x92f5;
  details[0].program_interface = this->m_n_active_subroutine_uniforms;
  details[0].pname = 0x92ee;
  details[0].expected_value = 0x92f6;
  details[1].program_interface = this->m_n_active_subroutine_uniform_name_length + 1;
  details[1].pname = 0x92ee;
  details[1].expected_value = 0x92f8;
  details[2].program_interface = this->m_n_active_subroutines;
  details[2].pname = 0x92e8;
  details[2].expected_value = 0x92f5;
  details[3].program_interface = this->m_n_active_subroutines;
  details[3].pname = 0x92e8;
  details[3].expected_value = 0x92f6;
  details[4].program_interface = this->m_n_active_subroutine_name_length + 1;
  for (local_60 = 0; local_60 < 5; local_60 = local_60 + 1) {
    bVar1 = checkProgramInterfaceiv
                      (this,program_id,(&i)[(ulong)local_60 * 3],
                       details[(ulong)local_60 - 1].expected_value,
                       details[local_60].program_interface);
    if (!bVar1) {
      details[4].expected_value._3_1_ = 0;
    }
  }
  return (bool)(details[4].expected_value._3_1_ & 1);
}

Assistant:

bool FunctionalTest3_4::inspectProgramInterfaceiv(glw::GLuint program_id) const
{
	bool result = true;

	const inspectionDetailsForProgramInterface details[] = {
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_ACTIVE_RESOURCES, m_n_active_subroutine_uniforms },
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NAME_LENGTH, m_n_active_subroutine_uniform_name_length + 1 },
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_VERTEX_SUBROUTINE, GL_ACTIVE_RESOURCES, m_n_active_subroutines },
		{ GL_VERTEX_SUBROUTINE, GL_MAX_NAME_LENGTH, m_n_active_subroutine_name_length + 1 }
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	for (GLuint i = 0; i < n_details; ++i)
	{
		if (false == checkProgramInterfaceiv(program_id, details[i].program_interface, details[i].pname,
											 details[i].expected_value))
		{
			result = false;
		}
	}

	return result;
}